

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  dfa d;
  allocator local_61;
  string local_60;
  _Hashtable<wchar_t,_std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_40;
  
  local_40._M_buckets = &local_40._M_single_bucket;
  local_40._M_bucket_count = 1;
  local_40._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_40._M_element_count = 0;
  local_40._M_rehash_policy._M_max_load_factor = 1.0;
  local_40._M_rehash_policy._M_next_resize = 0;
  local_40._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string((string *)&local_60,anon_var_dwarf_1d444,&local_61);
  dfa::add_word((dfa *)&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,anon_var_dwarf_1d467,&local_61);
  dfa::add_word((dfa *)&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,anon_var_dwarf_1d49d + 6,&local_61);
  dfa::add_word((dfa *)&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,anon_var_dwarf_1d49d + 0xc,&local_61);
  dfa::add_word((dfa *)&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,anon_var_dwarf_1d49d,&local_61);
  dfa::add_content((dfa *)&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::
  _Hashtable<wchar_t,_std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_40);
  return 0;
}

Assistant:

int main()
{
    dfa d;

    // 增加敏感词
    d.add_word("中国人");
    d.add_word("人民");
    d.add_word("人民共产党");
    d.add_word("共产党");

    // 增加待分析文本
    d.add_content("中国人民共产党");

    return 0;
}